

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyDrawMeshAttribs(MeshShaderProperties *MeshShaderProps,DrawMeshAttribs *Attribs)

{
  string _msg;
  Uint64 TotalGroups;
  _Alloc_hider in_stack_ffffffffffffffc0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  ulong local_20;
  
  if (Attribs->ThreadGroupCountX == 0) {
    FormatString<char[114]>
              ((string *)&stack0xffffffffffffffc0,
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,in_stack_ffffffffffffffc0._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  if (Attribs->ThreadGroupCountY == 0) {
    FormatString<char[114]>
              ((string *)&stack0xffffffffffffffc0,
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,in_stack_ffffffffffffffc0._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  if (Attribs->ThreadGroupCountZ == 0) {
    FormatString<char[114]>
              ((string *)&stack0xffffffffffffffc0,
               (char (*) [114])
               "DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,in_stack_ffffffffffffffc0._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  if (MeshShaderProps->MaxThreadGroupCountX < Attribs->ThreadGroupCountX) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)&stack0xffffffffffffffc0,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0x35660b,(char (*) [20])Attribs,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
               (char (*) [57])MeshShaderProps,(uint *)0x361241,
               (char (*) [3])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x5d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  if (MeshShaderProps->MaxThreadGroupCountY < Attribs->ThreadGroupCountY) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)&stack0xffffffffffffffc0,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0x35665a,(char (*) [20])&Attribs->ThreadGroupCountY,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountY,(uint *)0x361241,
               (char (*) [3])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  if (MeshShaderProps->MaxThreadGroupCountZ < Attribs->ThreadGroupCountZ) {
    FormatString<char[32],char[20],unsigned_int,char[57],unsigned_int,char[3]>
              ((string *)&stack0xffffffffffffffc0,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])0x356693,(char (*) [20])&Attribs->ThreadGroupCountZ,
               (uint *)") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
               (char (*) [57])&MeshShaderProps->MaxThreadGroupCountZ,(uint *)0x361241,
               (char (*) [3])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,99);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  local_20 = (ulong)Attribs->ThreadGroupCountZ *
             (ulong)Attribs->ThreadGroupCountY * (ulong)Attribs->ThreadGroupCountX;
  if (MeshShaderProps->MaxThreadGroupTotalCount <= local_20 &&
      local_20 - MeshShaderProps->MaxThreadGroupTotalCount != 0) {
    FormatString<char[32],char[27],unsigned_long,char[61],unsigned_int,char[3]>
              ((string *)&stack0xffffffffffffffc0,(Diligent *)"Draw mesh attribs are invalid: ",
               (char (*) [32])"Total thread group count (",(char (*) [27])&local_20,
               (unsigned_long *)") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
               (char (*) [61])&MeshShaderProps->MaxThreadGroupTotalCount,(uint *)0x361241,
               (char (*) [3])in_stack_ffffffffffffffc0._M_p);
    DebugAssertionFailed
              (in_stack_ffffffffffffffc0._M_p,"VerifyDrawMeshAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_ffffffffffffffc0._M_p != &local_30) {
      operator_delete(in_stack_ffffffffffffffc0._M_p,local_30._M_allocated_capacity + 1);
    }
  }
  return true;
}

Assistant:

bool VerifyDrawMeshAttribs(const MeshShaderProperties& MeshShaderProps, const DrawMeshAttribs& Attribs)
{
#define CHECK_DRAW_MESH_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Draw mesh attribs are invalid: ", __VA_ARGS__)

    if (Attribs.ThreadGroupCountX == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountX is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountY == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountY is 0. This is OK as the draw command will be ignored, but may be unintentional.");
    if (Attribs.ThreadGroupCountZ == 0)
        LOG_INFO_MESSAGE("DrawMeshAttribs.ThreadGroupCountZ is 0. This is OK as the draw command will be ignored, but may be unintentional.");

    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountX <= MeshShaderProps.MaxThreadGroupCountX,
                            "ThreadGroupCountX (", Attribs.ThreadGroupCountX, ") must not exceed MeshShaderProps.MaxThreadGroupCountX (",
                            MeshShaderProps.MaxThreadGroupCountX, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountY <= MeshShaderProps.MaxThreadGroupCountY,
                            "ThreadGroupCountY (", Attribs.ThreadGroupCountY, ") must not exceed MeshShaderProps.MaxThreadGroupCountY (",
                            MeshShaderProps.MaxThreadGroupCountY, ").");
    CHECK_DRAW_MESH_ATTRIBS(Attribs.ThreadGroupCountZ <= MeshShaderProps.MaxThreadGroupCountZ,
                            "ThreadGroupCountZ (", Attribs.ThreadGroupCountZ, ") must not exceed MeshShaderProps.MaxThreadGroupCountZ (",
                            MeshShaderProps.MaxThreadGroupCountZ, ").");

    const Uint64 TotalGroups = Uint64{Attribs.ThreadGroupCountX} * Uint64{Attribs.ThreadGroupCountY} * Uint64{Attribs.ThreadGroupCountZ};
    CHECK_DRAW_MESH_ATTRIBS(TotalGroups <= MeshShaderProps.MaxThreadGroupTotalCount,
                            "Total thread group count (", TotalGroups, ") must not exceed MeshShaderProps.MaxThreadGroupTotalCount (",
                            MeshShaderProps.MaxThreadGroupTotalCount, ").");

#undef CHECK_DRAW_MESH_ATTRIBS

    return true;
}